

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::GLSLContantValuesTest::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,GLSLContantValuesTest *this,GLuint param_1,
          ProgramInterface *param_2,STAGES stage)

{
  RenderContext *pRVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  GLint max_transform_feedback_interleaved_components;
  GLint max_transform_feedback_buffers;
  size_t position;
  GLchar buffer [16];
  uint local_58;
  uint local_54;
  size_t local_50;
  GLchar local_48 [24];
  long lVar4;
  
  pRVar1 = ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,this,CONCAT44(in_register_00000014,param_1));
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_54 = 0;
  local_58 = 0;
  (**(code **)(lVar4 + 0x868))(0x8e70);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2042);
  (**(code **)(lVar4 + 0x868))(0x8c8a,&local_58);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2044);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (stage == VERTEX) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1a0af93);
    local_50 = 0;
    sprintf(local_48,"%d",(ulong)local_54);
    Utils::replaceToken("MAX_TRANSFORM_FEEDBACK_BUFFERS",&local_50,local_48,__return_storage_ptr__);
    sprintf(local_48,"%d",(ulong)local_58);
    Utils::replaceToken("MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS",&local_50,local_48,
                        __return_storage_ptr__);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1af8059);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GLSLContantValuesTest::getVerificationSnippet(GLuint /* test_case_index */,
														  Utils::ProgramInterface& /* program_interface */,
														  Utils::Shader::STAGES stage)
{
	/* Get constants */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLint max_transform_feedback_buffers				= 0;
	GLint max_transform_feedback_interleaved_components = 0;

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_BUFFERS, &max_transform_feedback_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, &max_transform_feedback_interleaved_components);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::string verification;

	if (Utils::Shader::VERTEX == stage)
	{
		verification = "if (1 != GL_ARB_enhanced_layouts)\n"
					   "    {\n"
					   "        result = 0;\n"
					   "    }\n"
					   "    else if (MAX_TRANSFORM_FEEDBACK_BUFFERS\n"
					   "        != gl_MaxTransformFeedbackBuffers)\n"
					   "    {\n"
					   "        result = 0;\n"
					   "    }\n"
					   "    else if (MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS \n"
					   "        != gl_MaxTransformFeedbackInterleavedComponents)\n"
					   "    {\n"
					   "        result = 0;\n"
					   "    }\n";

		size_t position = 0;
		GLchar buffer[16];

		sprintf(buffer, "%d", max_transform_feedback_buffers);
		Utils::replaceToken("MAX_TRANSFORM_FEEDBACK_BUFFERS", position, buffer, verification);

		sprintf(buffer, "%d", max_transform_feedback_interleaved_components);
		Utils::replaceToken("MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS", position, buffer, verification);
	}
	else
	{
		verification = "";
	}

	return verification;
}